

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O0

int Lf_CutCompareArea(Lf_Cut_t *pCut0,Lf_Cut_t *pCut1)

{
  Lf_Cut_t *pCut1_local;
  Lf_Cut_t *pCut0_local;
  
  if ((*(uint *)&pCut0->field_0x14 >> 0x16 & 1) < (*(uint *)&pCut1->field_0x14 >> 0x16 & 1)) {
    pCut0_local._4_4_ = -1;
  }
  else if ((*(uint *)&pCut1->field_0x14 >> 0x16 & 1) < (*(uint *)&pCut0->field_0x14 >> 0x16 & 1)) {
    pCut0_local._4_4_ = 1;
  }
  else if (pCut1->Flow - 0.005 <= pCut0->Flow) {
    if (pCut0->Flow <= pCut1->Flow + 0.005) {
      if (pCut0->Delay < pCut1->Delay) {
        pCut0_local._4_4_ = -1;
      }
      else if (pCut1->Delay < pCut0->Delay) {
        pCut0_local._4_4_ = 1;
      }
      else if (*(uint *)&pCut0->field_0x14 >> 0x18 < *(uint *)&pCut1->field_0x14 >> 0x18) {
        pCut0_local._4_4_ = -1;
      }
      else if (*(uint *)&pCut1->field_0x14 >> 0x18 < *(uint *)&pCut0->field_0x14 >> 0x18) {
        pCut0_local._4_4_ = 1;
      }
      else {
        pCut0_local._4_4_ = 0;
      }
    }
    else {
      pCut0_local._4_4_ = 1;
    }
  }
  else {
    pCut0_local._4_4_ = -1;
  }
  return pCut0_local._4_4_;
}

Assistant:

static inline int Lf_CutCompareArea( Lf_Cut_t * pCut0, Lf_Cut_t * pCut1 )
{
    if ( pCut0->fLate   < pCut1->fLate   )  return -1;
    if ( pCut0->fLate   > pCut1->fLate   )  return  1;
    if ( pCut0->Flow    < pCut1->Flow - LF_EPSILON )  return -1;
    if ( pCut0->Flow    > pCut1->Flow + LF_EPSILON )  return  1;
    if ( pCut0->Delay   < pCut1->Delay   )  return -1;
    if ( pCut0->Delay   > pCut1->Delay   )  return  1;
    if ( pCut0->nLeaves < pCut1->nLeaves )  return -1;
    if ( pCut0->nLeaves > pCut1->nLeaves )  return  1;
    return 0;
}